

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *dst,entityfilter_ctx *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  
  if (src == (entityfilter_ctx *)0x0) {
    __assert_fail("src != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x150,
                  "void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *, entityfilter_ctx *)"
                 );
  }
  if (dst != (entityfilter_ctx *)0x0) {
    if (src != dst) {
      iVar3 = src->buffer_pos;
      iVar4 = src->in_entity;
      uVar1 = *(undefined8 *)src->buffer;
      uVar2 = *(undefined8 *)(src->output + 2);
      *(undefined8 *)(dst->buffer + 4) = *(undefined8 *)(src->buffer + 4);
      *(undefined8 *)(dst->output + 2) = uVar2;
      dst->buffer_pos = iVar3;
      dst->in_entity = iVar4;
      *(undefined8 *)dst->buffer = uVar1;
      return;
    }
    __assert_fail("src != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x152,
                  "void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *, entityfilter_ctx *)"
                 );
  }
  __assert_fail("dst != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x151,
                "void ctemplate_htmlparser::entityfilter_copy(entityfilter_ctx *, entityfilter_ctx *)"
               );
}

Assistant:

void entityfilter_copy(entityfilter_ctx *dst, entityfilter_ctx *src)
{
  assert(src != NULL);
  assert(dst != NULL);
  assert(src != dst);
  memcpy(dst, src, sizeof(entityfilter_ctx));
}